

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3cb2mllr_io.c
# Opt level: O1

int s3cb2mllr_read(char *fn,int32 **out_cb2mllr,uint32 *out_n_cb,uint32 *out_n_mllr)

{
  uint32 uVar1;
  uint uVar2;
  int32 *piVar3;
  bool bVar4;
  int iVar5;
  void *ptr;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  iVar5 = s3map_read(fn,out_cb2mllr,out_n_cb,out_n_mllr,4);
  if (iVar5 == 0) {
    uVar1 = *out_n_cb;
    uVar10 = (ulong)(int)uVar1;
    piVar3 = *out_cb2mllr;
    ptr = __ckd_calloc__((long)(int)*out_n_mllr,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                         ,0x50);
    if (0 < (long)uVar10) {
      uVar7 = 0;
      do {
        uVar2 = piVar3[uVar7];
        if ((int)*out_n_mllr <= (int)uVar2) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                  ,0x55,"%s cb2mllr[%d] -> %d which is >= n_mllr_class (%d)\n",fn,uVar7,(ulong)uVar2
                  ,(ulong)*out_n_mllr);
          goto LAB_0010582f;
        }
        if (-1 < (int)uVar2) {
          *(undefined4 *)((long)ptr + (ulong)uVar2 * 4) = 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
    if ((int)uVar1 < 1) {
      uVar7 = 0;
      bVar4 = true;
      uVar8 = 0xffffffff;
    }
    else {
      uVar8 = (ulong)(uVar1 - 1);
      uVar9 = 0;
      uVar7 = 0;
      bVar4 = false;
      do {
        lVar6 = (long)piVar3[uVar9];
        if (-1 < lVar6) {
          bVar11 = false;
          if ((!bVar4) && (bVar11 = *(int *)((long)ptr + lVar6 * 4) != 0, !bVar11)) {
            uVar7 = uVar9 & 0xffffffff;
          }
          if (bVar11) {
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (*(int *)((long)ptr + lVar6 * 4) == 1) {
              lVar6 = 0x62;
              uVar8 = (ulong)((int)uVar9 - 1);
              goto LAB_00105828;
            }
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      bVar4 = !bVar4;
    }
    if (!bVar4) {
      lVar6 = 0x67;
LAB_00105828:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
              ,lVar6,"cb unmapped in region [%u %u]\n",uVar7,uVar8);
LAB_0010582f:
      exit(1);
    }
    ckd_free(ptr);
  }
  return iVar5;
}

Assistant:

int
s3cb2mllr_read(const char *fn,
	       int32 **out_cb2mllr,
	       uint32 *out_n_cb,
	       uint32 *out_n_mllr)
{
    int ret, i, n_d, n_r;
    int *did_map;
    int32 *cb2mllr;
    int in_hole = FALSE;
    int beg_hole = 0;

    ret = s3map_read(fn,
		     (void **)out_cb2mllr,
		     out_n_cb,
		     out_n_mllr,
		     sizeof(int32));

    
    if (ret == S3_SUCCESS) {
	n_d = *out_n_cb;
	n_r = *out_n_mllr;
	cb2mllr = *out_cb2mllr;
	
	did_map = ckd_calloc(n_r, sizeof(int));

	for (i = 0; i < n_d; i++) {
	    if (cb2mllr[i] >= (int32)*out_n_mllr) {
		E_FATAL("%s cb2mllr[%d] -> %d which is >= n_mllr_class (%d)\n",
			fn, i, cb2mllr[i], *out_n_mllr);
	    }
	    else if (cb2mllr[i] >= 0)
		did_map[cb2mllr[i]] = IS_MAPPED;
	}
	
	for (i = 0; i < n_d; i++) {
	    if (cb2mllr[i] < 0) continue; /* skipped */
	    if (!in_hole && (did_map[cb2mllr[i]] == NOT_MAPPED)) {
		beg_hole = i;
		in_hole = TRUE;
	    }
	    if (in_hole && (did_map[cb2mllr[i]] == IS_MAPPED)) {
		E_FATAL("cb unmapped in region [%u %u]\n", beg_hole, i-1);
		in_hole = FALSE;
	    }
	}
	if (in_hole) {
	    E_FATAL("cb unmapped in region [%u %u]\n", beg_hole, i-1);
	}

	ckd_free(did_map);
    }

    return ret;
}